

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::GenerateMemCopy(Lowerer *this,Opnd *dst,Opnd *src,uint32 size,Instr *insertBeforeInstr)

{
  Func *func_00;
  IntConstOpnd *opndArg;
  Instr *this_00;
  HelperCallOpnd *newSrc;
  Instr *memcpyInstr;
  Func *func;
  Instr *insertBeforeInstr_local;
  uint32 size_local;
  Opnd *src_local;
  Opnd *dst_local;
  Lowerer *this_local;
  
  func_00 = this->m_func;
  opndArg = IR::IntConstOpnd::New((ulong)size,TyUint32,func_00,false);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,insertBeforeInstr,&opndArg->super_Opnd);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,insertBeforeInstr,src);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,insertBeforeInstr,dst);
  this_00 = IR::Instr::New(Call,func_00);
  newSrc = IR::HelperCallOpnd::New(HelperMemCpy,func_00);
  IR::Instr::SetSrc1(this_00,&newSrc->super_Opnd);
  IR::Instr::InsertBefore(insertBeforeInstr,this_00);
  LowererMD::LowerCall(&this->m_lowererMD,this_00,3);
  return;
}

Assistant:

void
Lowerer::GenerateMemCopy(IR::Opnd * dst, IR::Opnd * src, uint32 size, IR::Instr * insertBeforeInstr)
{
    Func * func = this->m_func;
    this->m_lowererMD.LoadHelperArgument(insertBeforeInstr, IR::IntConstOpnd::New(size, TyUint32, func));
    this->m_lowererMD.LoadHelperArgument(insertBeforeInstr, src);
    this->m_lowererMD.LoadHelperArgument(insertBeforeInstr, dst);
    IR::Instr * memcpyInstr = IR::Instr::New(Js::OpCode::Call, func);
    memcpyInstr->SetSrc1(IR::HelperCallOpnd::New(IR::HelperMemCpy, func));
    insertBeforeInstr->InsertBefore(memcpyInstr);
    m_lowererMD.LowerCall(memcpyInstr, 3);
}